

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckOpcode3(TypeChecker *this,Opcode opcode)

{
  Type TVar1;
  Type expected2;
  Type expected3;
  Result RVar2;
  char *desc;
  Opcode local_34 [2];
  Opcode opcode_local;
  
  TVar1 = Opcode::GetParamType1(local_34);
  expected2 = Opcode::GetParamType2(local_34);
  expected3 = Opcode::GetParamType3(local_34);
  desc = Opcode::GetName(local_34);
  RVar2 = PopAndCheck3Types(this,TVar1,expected2,expected3,desc);
  TVar1 = Opcode::GetResultType(local_34);
  PushType(this,TVar1);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode) {
  Result result =
      PopAndCheck3Types(opcode.GetParamType1(), opcode.GetParamType2(),
                        opcode.GetParamType3(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}